

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_adaptive.cpp
# Opt level: O1

subscription_storage_factory_t *
so_5::adaptive_subscription_storage_factory
          (subscription_storage_factory_t *__return_storage_ptr__,size_t threshold,
          subscription_storage_factory_t *small_storage_factory,
          subscription_storage_factory_t *large_storage_factory)

{
  size_t *psVar1;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  ::function((function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
              *)&local_68,small_storage_factory);
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  ::function((function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
              *)&local_48,large_storage_factory);
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  psVar1 = (size_t *)operator_new(0x48);
  *psVar1 = threshold;
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  ::function((function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
              *)(psVar1 + 1),
             (function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
              *)&local_68);
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  ::function((function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
              *)(psVar1 + 5),
             (function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
              *)&local_48);
  *(size_t **)&(__return_storage_ptr__->super__Function_base)._M_functor = psVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/subscr_storage_adaptive.cpp:278:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/subscr_storage_adaptive.cpp:278:10)>
       ::_M_manager;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

SO_5_FUNC subscription_storage_factory_t
adaptive_subscription_storage_factory(
	std::size_t threshold,
	const subscription_storage_factory_t & small_storage_factory,
	const subscription_storage_factory_t & large_storage_factory )
	{
		return [=]( agent_t * owner ) {
			return impl::subscription_storage_unique_ptr_t(
					new impl::adaptive_subscr_storage::storage_t(
							owner,
							threshold,
							small_storage_factory( owner ),
							large_storage_factory( owner ) ) );
		};
	}